

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_open_directory(ALLEGRO_FS_ENTRY *fp)

{
  ALLEGRO_FS_INTERFACE *pAVar1;
  int *piVar2;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  
  if (((ulong)fp[2].vtable & 0x20) == 0) {
    return false;
  }
  pAVar1 = (ALLEGRO_FS_INTERFACE *)opendir((char *)fp[1].vtable);
  fp[0x15].vtable = pAVar1;
  if (pAVar1 == (ALLEGRO_FS_INTERFACE *)0x0) {
    piVar2 = __errno_location();
    al_set_errno(*piVar2);
  }
  return pAVar1 != (ALLEGRO_FS_INTERFACE *)0x0;
}

Assistant:

static bool fs_stdio_open_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;

   if (!(fp_stdio->stat_mode & ALLEGRO_FILEMODE_ISDIR))
      return false;

   fp_stdio->dir = WRAP_OPENDIR(fp_stdio->abs_path);
   if (!fp_stdio->dir) {
      al_set_errno(errno);
      return false;
   }

   return true;
}